

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O0

bool __thiscall
avro::BufferReader::read<unsigned_long>(BufferReader *this,unsigned_long *val,true_type *param_3)

{
  size_type __nbytes;
  data_type *pdVar1;
  BufferReader *in_RDX;
  undefined8 *in_RSI;
  BufferReader *in_RDI;
  BufferReader *this_00;
  bool local_1;
  
  if (*(ulong *)(in_RDI + 0x38) < 8) {
    local_1 = false;
  }
  else {
    this_00 = in_RDI;
    __nbytes = chunkRemaining(in_RDX);
    if (__nbytes < 8) {
      read(in_RDI,(int)in_RSI,(void *)0x8,__nbytes);
    }
    else {
      pdVar1 = addr(in_RDX);
      *in_RSI = *(undefined8 *)pdVar1;
      incrementChunk(this_00,(size_type)in_RSI);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool read(T &val, const boost::true_type&)
    {
        if(sizeof(T) > bytesRemaining_) {
            return false;
        }

        if (sizeof(T) <= chunkRemaining()) {
            val = *(reinterpret_cast<const T*> (addr()));
            incrementChunk(sizeof(T));
        }
        else {
            read(reinterpret_cast<data_type *>(&val), sizeof(T));
        }
        return true;
    }